

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O3

void __thiscall Printer::printBoard(Printer *this,Board *board,Player *player1)

{
  bool bVar1;
  ostream *poVar2;
  Cell *pCVar3;
  Player *pPVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  int j;
  undefined8 *puVar10;
  int iVar11;
  string LTTRS;
  Cell c;
  char local_a5;
  undefined4 local_a4;
  ulong local_a0;
  ulong local_98;
  Printer *local_90;
  int local_84;
  undefined8 *local_80;
  undefined1 *local_78;
  undefined8 *local_70;
  undefined1 local_68 [16];
  Cell local_58;
  Player *local_40;
  Board *local_38;
  
  local_78 = local_68;
  local_90 = this;
  local_40 = player1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"ABCDEFGHJKLMNOPQRSTUVWXYZ","");
  uVar9 = board->size;
  local_a0 = (ulong)(int)uVar9;
  local_98 = (long)local_a0 / 10 + ((long)local_a0 >> 0x3f);
  local_80 = (undefined8 *)(ulong)uVar9;
  iVar11 = ((int)local_98 - ((int)uVar9 >> 0x1f)) + 2;
  local_38 = board;
  if (-0x14 < (long)local_a0) {
    iVar7 = 1;
    if (1 < iVar11) {
      iVar7 = iVar11;
    }
    do {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
    local_a4 = (undefined4)CONCAT71((int7)((ulong)poVar2 >> 8),0 < (int)(uint)local_a0);
    if (0 < (int)(uint)local_a0) {
      puVar6 = (undefined8 *)0x0;
      do {
        if (local_70 <= puVar6) goto LAB_00102009;
        local_58.row_coordinate._0_1_ = local_78[(long)puVar6];
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)&local_58,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        puVar6 = (undefined8 *)((long)puVar6 + 1);
      } while (local_80 != puVar6);
      goto LAB_00101bc5;
    }
  }
  local_a4 = 0;
LAB_00101bc5:
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  uVar9 = (int)local_98 - ((int)uVar9 >> 0x1f);
  if (-10 < (int)(uint)local_a0) {
    iVar7 = uVar9 + 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  local_98 = (ulong)uVar9;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"+",1);
  if ((char)local_a4 != '\0') {
    uVar8 = local_a0 & 0xffffffff;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--",2);
      uVar9 = (int)uVar8 - 1;
      uVar8 = (ulong)uVar9;
    } while (uVar9 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"+",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  local_84 = iVar11;
  if ((char)local_a4 != '\0') {
    uVar8 = 0;
    do {
      iVar11 = (int)uVar8;
      iVar7 = (int)local_98 - (int)(uVar8 / 10);
      if (0 < iVar7) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"|",1);
      iVar7 = 0;
      do {
        pCVar3 = Board::getCell(local_38,iVar11,iVar7);
        local_58.playerOwned = pCVar3->playerOwned;
        local_58.row_coordinate = pCVar3->row_coordinate;
        local_58.column_coordinate = pCVar3->column_coordinate;
        local_58.occupied = pCVar3->occupied;
        local_58._9_7_ = *(undefined7 *)&pCVar3->field_0x9;
        bVar1 = Cell::isOccupied(&local_58);
        if (bVar1) {
          pPVar4 = Cell::getPlayerOwned(&local_58);
          if (pPVar4 == local_40) {
            local_a5 = local_90->player1Icon;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_a5,1);
          }
          else {
            local_a5 = local_90->player2Icon;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_a5,1);
          }
        }
        else {
          local_a5 = local_90->emptyCellIcon;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_a5,1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        iVar7 = iVar7 + 1;
      } while ((uint)local_a0 != iVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
      std::ostream::operator<<((ostream *)&std::cout,iVar11);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
      uVar8 = (ulong)(iVar11 + 1U);
    } while (iVar11 + 1U != (uint)local_a0);
  }
  iVar11 = local_84;
  if (-10 < (int)(uint)local_a0) {
    iVar7 = (int)local_98 + 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"+",1);
  if ((char)local_a4 != '\0') {
    uVar8 = local_a0 & 0xffffffff;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--",2);
      uVar9 = (int)uVar8 - 1;
      uVar8 = (ulong)uVar9;
    } while (uVar9 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"+",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  puVar6 = &std::cout;
  std::ostream::flush();
  if (-0x14 < (int)(uint)local_a0) {
    iVar7 = 1;
    if (1 < iVar11) {
      iVar7 = iVar11;
    }
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  if ((char)local_a4 != '\0') {
    puVar10 = (undefined8 *)0x0;
    do {
      if (local_70 <= puVar10) {
        std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",puVar10);
LAB_00102009:
        uVar5 = std::__throw_out_of_range_fmt
                          ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",
                           puVar6);
        if (local_78 != local_68) {
          operator_delete(local_78);
        }
        _Unwind_Resume(uVar5);
      }
      local_58.row_coordinate._0_1_ = local_78[(long)puVar10];
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)&local_58,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      puVar10 = (undefined8 *)((long)puVar10 + 1);
    } while (local_80 != puVar10);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  return;
}

Assistant:

void Printer::printBoard(Board& board, const Player* player1){

  const string LTTRS = "ABCDEFGHJKLMNOPQRSTUVWXYZ";
  int n = board.size;

  // printing header
  for (int i=0; i<n/10+2; i++) cout << " "; // print offset created by row numbering
  for (int i=0; i<n; i++) cout << LTTRS.at(i) << " ";
  cout.put(cout.widen('\n'));
  cout.flush();
  for (int i=0; i<n/10+1; i++) cout << " ";
  cout << "+";
  for (int i=0; i<n; i++) cout <<"--";
  cout << "+";
  cout.put(cout.widen('\n'));
  cout.flush();

  // printing each row
  for (int i=0; i<n; i++){

    // printing row numbering at left side
    for (int j=0; j<n/10-i/10; j++) cout << " "; // print trailing spaces for formatting
    cout << i << "|";

    for (int j=0; j<n; j++){

        Cell c = board.getCell(i,j);
        if (!c.isOccupied()) cout << this->emptyCellIcon;
        else if (c.getPlayerOwned() == player1) cout << this ->player1Icon;
        else cout << this->player2Icon;

        cout << " ";
    }
    // printing row numbering at the right side
    cout << "|" << i;
    cout.put(cout.widen('\n'));
    cout.flush();
  }

  // printing footer
  for (int i=0; i<n/10+1; i++) cout << " ";
  cout << "+";
  for (int i=0; i<n; i++) cout <<"--";
  cout << "+";
  cout.put(cout.widen('\n'));
  cout.flush();
  for (int i=0; i<n/10+2; i++) cout << " ";
  for (int i=0; i<n; i++) cout << LTTRS.at(i) << " ";
  cout.put(cout.widen('\n'));
  cout.flush();

}